

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O2

int dowieldquiver(obj *newquiver)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  
  if ((uwep == (obj *)0x0) || (objects[uwep->otyp].oc_subtyp != '\x17')) {
    if (uswapwep == (obj *)0x0) {
      pcVar3 = "\x14\x15\x02";
    }
    else {
      pcVar3 = "\x14\x15\x02";
      if (objects[uswapwep->otyp].oc_subtyp == '\x17') {
        pcVar3 = "\x14\x15\r\x02";
      }
    }
  }
  else {
    pcVar3 = "\x14\x15\r\x02";
  }
  multi = 0;
  if (newquiver == (obj *)0x0) {
    newquiver = getobj(pcVar3,"ready",(obj **)0x0);
    if (newquiver == (obj *)0x0) {
      return 0;
    }
  }
  else {
    bVar1 = validate_object(newquiver,pcVar3,"ready");
    if (bVar1 == '\0') {
      return 0;
    }
  }
  if (newquiver == &zeroobj) {
    if (uquiver != (obj *)0x0) {
      newquiver = (obj *)0x0;
      pline("You now have no ammunition readied.");
      setuqwep((obj *)0x0);
LAB_00272aad:
      setuqwep(newquiver);
      return 0;
    }
    pcVar3 = "You already have no ammunition readied!";
  }
  else if (newquiver == uquiver) {
    pcVar3 = "That ammunition is already readied!";
  }
  else {
    if (newquiver == uwep) {
      if (uwep->quan < 2) {
        pcVar3 = "That is";
        if (uwep->oartifact == '\x1d') {
          pcVar3 = "They are";
        }
      }
      else {
        pcVar3 = "They are";
      }
      pline("%s already being used as a weapon!",pcVar3);
      return 0;
    }
    uVar2 = newquiver->owornmask;
    if ((uVar2 & 0x1f007f) == 0) {
      if (newquiver == uswapwep) {
        setuswapwep((obj *)0x0);
        untwoweapon();
        uVar2 = newquiver->owornmask;
      }
      newquiver->owornmask = uVar2 | 0x200;
      prinv((char *)0x0,newquiver,0);
      newquiver->owornmask = uVar2;
      goto LAB_00272aad;
    }
    pcVar3 = "You cannot ready that!";
  }
  pline(pcVar3);
  return 0;
}

Assistant:

int dowieldquiver(struct obj *newquiver)
{
	const char *quivee_types = (uslinging() ||
		  (uswapwep && objects[uswapwep->otyp].oc_skill == P_SLING)) ?
				  bullets : ready_objs;

	/* Since the quiver isn't in your hands, don't check cantwield(), */
	/* will_weld(), touch_petrifies(), etc. */
	multi = 0;

	if (newquiver && !validate_object(newquiver, quivee_types, "ready"))
		return 0;
	else if (!newquiver)
		/* Prompt for a new quiver */
		newquiver = getobj(quivee_types, "ready", NULL);
	if (!newquiver)
		/* Cancelled */
		return 0;

	/* Handle no object, or object in other slot */
	/* Any type is okay, since we give no intrinsics anyways */
	if (newquiver == &zeroobj) {
		/* Explicitly nothing */
		if (uquiver) {
			pline("You now have no ammunition readied.");
			setuqwep(newquiver = NULL);
		} else {
			pline("You already have no ammunition readied!");
			return 0;
		}
	} else if (newquiver == uquiver) {
		pline("That ammunition is already readied!");
		return 0;
	} else if (newquiver == uwep) {
		/* Prevent accidentally readying the main weapon */
		pline("%s already being used as a weapon!",
		      !is_plural(uwep) ? "That is" : "They are");
		return 0;
	} else if (newquiver->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL
			| W_SADDLE)) {
		pline("You cannot ready that!");
		return 0;
	} else {
		long dummy;


		/* Check if it's the secondary weapon */
		if (newquiver == uswapwep) {
			setuswapwep(NULL);
			untwoweapon();
		}

		/* Okay to put in quiver; print it */
		dummy = newquiver->owornmask;
		newquiver->owornmask |= W_QUIVER;
		prinv(NULL, newquiver, 0L);
		newquiver->owornmask = dummy;
	}

	/* Finally, place it in the quiver */
	setuqwep(newquiver);
	/* Take no time since this is a convenience slot */
	return 0;
}